

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O3

bool __thiscall
chrono::collision::ChCollisionModelBullet::AddCylinder
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,double rx,
          double rz,double hy,ChVector<double> *pos,ChMatrix33<double> *rot)

{
  undefined1 auVar1 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ChCollisionShapeBullet *this_00;
  cbtCollisionShape *this_01;
  float fVar7;
  float fVar8;
  undefined4 uVar12;
  undefined8 uVar9;
  undefined4 uVar13;
  undefined8 in_XMM0_Qb;
  undefined1 auVar10 [16];
  undefined4 uVar15;
  undefined8 uVar14;
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar17 [16];
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  double local_78;
  undefined8 uStack_70;
  double local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  cbtVector3 local_38;
  
  local_78 = rx;
  uStack_70 = in_XMM0_Qb;
  local_68 = hy;
  uStack_60 = in_XMM2_Qb;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x23])();
  auVar3._8_8_ = uStack_70;
  auVar3._0_8_ = local_78;
  auVar10._0_8_ = (double)SUB84(rx,0);
  auVar10._8_8_ = in_XMM0_Qb;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = rz;
  auVar1 = vminsd_avx(auVar3,auVar1);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_68 * 0.5;
  auVar1 = vminsd_avx(auVar1,auVar17);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = auVar1._0_8_ * 0.2;
  auVar1 = vminsd_avx(auVar10,auVar16);
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x22])(auVar1._0_8_,this);
  this_00 = (ChCollisionShapeBullet *)::operator_new(0x28);
  fVar7 = *(float *)&(material->
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
  uVar12 = *(undefined4 *)
            ((long)&(material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr + 4);
  uVar13 = *(undefined4 *)
            &(material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
  uVar15 = *(undefined4 *)
            ((long)&(material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
                    _M_refcount._M_pi + 4);
  p_Var2 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  local_88 = fVar7;
  uStack_84 = uVar12;
  uStack_80 = uVar13;
  uStack_7c = uVar15;
  ChCollisionShapeBullet::ChCollisionShapeBullet
            (this_00,CYLINDER,(shared_ptr<chrono::ChMaterialSurface> *)&local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_7c,uStack_80));
  }
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_48 = fVar7;
  uStack_44 = uVar12;
  uStack_40 = uVar13;
  uStack_3c = uVar15;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  fVar8 = (float)((double)fVar7 + rz);
  uVar9 = CONCAT44((int)((ulong)((double)fVar7 + rz) >> 0x20),fVar8);
  uVar14 = 0;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x25])(this);
  local_58 = uVar9;
  uStack_50 = uVar14;
  this_01 = (cbtCollisionShape *)cbtAlignedAllocInternal(0x48,0x10);
  auVar6._4_4_ = uStack_44;
  auVar6._0_4_ = local_48;
  auVar6._8_4_ = uStack_40;
  auVar6._12_4_ = uStack_3c;
  auVar4._8_8_ = uStack_70;
  auVar4._0_8_ = local_78;
  auVar1 = vinsertps_avx(auVar6,ZEXT416((uint)local_58),0x10);
  auVar5._8_8_ = uStack_60;
  auVar5._0_8_ = local_68;
  auVar3 = vunpcklpd_avx(auVar4,auVar5);
  auVar1 = vcvtps2pd_avx(auVar1);
  auVar11._0_8_ = auVar3._0_8_ + auVar1._0_8_;
  auVar11._8_8_ = auVar3._8_8_ + auVar1._8_8_;
  auVar1 = vcvtpd2ps_avx(auVar11);
  local_38.m_floats._0_8_ = vmovlps_avx(auVar1);
  local_38.m_floats[3] = 0.0;
  local_38.m_floats[2] = fVar8;
  cbtCylinderShape::cbtCylinderShape((cbtCylinderShape *)this_01,&local_38);
  this_00->m_bt_shape = this_01;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
  (*this_01->_vptr_cbtCollisionShape[0xb])(this_01);
  injectShape(this,pos,rot,this_00);
  return true;
}

Assistant:

bool ChCollisionModelBullet::AddCylinder(std::shared_ptr<ChMaterialSurface> material,
                                         double rx,
                                         double rz,
                                         double hy,
                                         const ChVector<>& pos,
                                         const ChMatrix33<>& rot) {
    // adjust default inward margin (if object too thin)
    SetSafeMargin(ChMin(GetSafeMargin(), 0.2 * ChMin(ChMin(rx, rz), 0.5 * hy)));

    auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::CYLINDER, material);

    cbtScalar arx = (cbtScalar)(rx + GetEnvelope());
    cbtScalar arz = (cbtScalar)(rz + GetEnvelope());
    cbtScalar ahy = (cbtScalar)(hy + GetEnvelope());
    shape->m_bt_shape = new cbtCylinderShape(cbtVector3(arx, ahy, arz));
    shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());

    injectShape(pos, rot, shape);
    return true;
}